

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

int32 dumb_it_build_checkpoints(DUMB_IT_SIGDATA *sigdata,int startorder)

{
  int32 iVar1;
  long *__ptr;
  DUMB_IT_SIGRENDERER *pDVar2;
  void *pvVar3;
  undefined4 in_ESI;
  double in_RDI;
  DUMB_IT_SIGRENDERER *sigrenderer;
  int32 l;
  IT_CHECKPOINT *next_1;
  IT_CHECKPOINT *checkpoint_1;
  IT_CHECKPOINT *next;
  IT_CHECKPOINT *checkpoint;
  IT_CALLBACKS *in_stack_ffffffffffffffc8;
  sigrenderer_t *in_stack_ffffffffffffffd0;
  IT_CALLBACKS *vsigrenderer;
  DUMB_IT_SIGRENDERER *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI != 0.0) {
    pDVar2 = *(DUMB_IT_SIGRENDERER **)((long)in_RDI + 0x130);
    while (pDVar2 != (DUMB_IT_SIGRENDERER *)0x0) {
      in_stack_ffffffffffffffd8 = (DUMB_IT_SIGRENDERER *)pDVar2->sigdata;
      _dumb_it_end_sigrenderer(in_stack_ffffffffffffffd0);
      free(pDVar2);
      pDVar2 = in_stack_ffffffffffffffd8;
    }
    *(undefined8 *)((long)in_RDI + 0x130) = 0;
    __ptr = (long *)malloc(0x18);
    if (__ptr != (long *)0x0) {
      *(undefined4 *)(__ptr + 1) = 0;
      pDVar2 = dumb_it_init_sigrenderer
                         ((DUMB_IT_SIGDATA *)in_stack_ffffffffffffffd8,
                          (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                          (int)in_stack_ffffffffffffffd0);
      __ptr[2] = (long)pDVar2;
      if (__ptr[2] == 0) {
        free(__ptr);
      }
      else {
        **(undefined8 **)(__ptr[2] + 0x2e70) = dumb_it_callback_terminate;
        *(code **)(*(long *)(__ptr[2] + 0x2e70) + 0x10) = dumb_it_callback_terminate;
        *(code **)(*(long *)(__ptr[2] + 0x2e70) + 0x30) = dumb_it_callback_terminate;
        if (*(long *)((long)in_RDI + 0x130) != 0) {
          vsigrenderer = *(IT_CALLBACKS **)((long)in_RDI + 0x130);
          while (vsigrenderer != (IT_CALLBACKS *)0x0) {
            in_stack_ffffffffffffffc8 = (IT_CALLBACKS *)vsigrenderer->loop;
            _dumb_it_end_sigrenderer(vsigrenderer);
            free(vsigrenderer);
            vsigrenderer = in_stack_ffffffffffffffc8;
          }
          in_stack_ffffffffffffffd0 = (sigrenderer_t *)0x0;
        }
        *(long **)((long)in_RDI + 0x130) = __ptr;
        do {
          pDVar2 = dup_sigrenderer(in_stack_ffffffffffffffd8,
                                   (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                                   in_stack_ffffffffffffffc8);
          *(undefined8 *)(__ptr[2] + 0x2e70) = 0;
          if (pDVar2 == (DUMB_IT_SIGRENDERER *)0x0) {
            *__ptr = 0;
            return (int32)__ptr[1];
          }
          iVar1 = it_sigrenderer_get_samples
                            ((sigrenderer_t *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                             (double)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                             (int32)((ulong)__ptr >> 0x20),
                             (sample_t_conflict **)in_stack_ffffffffffffffd8);
          if (iVar1 < 0x1e0000) {
            _dumb_it_end_sigrenderer(in_stack_ffffffffffffffd0);
            *__ptr = 0;
            return (int)__ptr[1] + iVar1;
          }
          pvVar3 = malloc(0x18);
          *__ptr = (long)pvVar3;
          if (*__ptr == 0) {
            _dumb_it_end_sigrenderer(in_stack_ffffffffffffffd0);
            return (int)__ptr[1] + 0x1e0000;
          }
          *(int *)(*__ptr + 8) = (int)__ptr[1] + 0x1e0000;
          __ptr = (long *)*__ptr;
          __ptr[2] = (long)pDVar2;
        } while ((int)__ptr[1] < 0x1c200000);
        *__ptr = 0;
      }
    }
  }
  return 0;
}

Assistant:

int32 DUMBEXPORT dumb_it_build_checkpoints(DUMB_IT_SIGDATA *sigdata, int startorder)
{
	IT_CHECKPOINT *checkpoint;
	if (!sigdata) return 0;
	checkpoint = sigdata->checkpoint;
	while (checkpoint) {
		IT_CHECKPOINT *next = checkpoint->next;
		_dumb_it_end_sigrenderer(checkpoint->sigrenderer);
		free(checkpoint);
		checkpoint = next;
	}
	sigdata->checkpoint = NULL;
	checkpoint = malloc(sizeof(*checkpoint));
	if (!checkpoint) return 0;
	checkpoint->time = 0;
	checkpoint->sigrenderer = dumb_it_init_sigrenderer(sigdata, 0, startorder);
	if (!checkpoint->sigrenderer) {
		free(checkpoint);
		return 0;
	}
	checkpoint->sigrenderer->callbacks->loop = &dumb_it_callback_terminate;
	checkpoint->sigrenderer->callbacks->xm_speed_zero = &dumb_it_callback_terminate;
	checkpoint->sigrenderer->callbacks->global_volume_zero = &dumb_it_callback_terminate;

	if (sigdata->checkpoint)
	{
		IT_CHECKPOINT *checkpoint = sigdata->checkpoint;
		while (checkpoint) {
			IT_CHECKPOINT *next = checkpoint->next;
			_dumb_it_end_sigrenderer(checkpoint->sigrenderer);
			free(checkpoint);
			checkpoint = next;
		}
	}

	sigdata->checkpoint = checkpoint;

	for (;;) {
		int32 l;
		DUMB_IT_SIGRENDERER *sigrenderer = dup_sigrenderer(checkpoint->sigrenderer, 0, checkpoint->sigrenderer->callbacks);
		checkpoint->sigrenderer->callbacks = NULL;
		if (!sigrenderer) {
			checkpoint->next = NULL;
			return checkpoint->time;
		}

		l = it_sigrenderer_get_samples(sigrenderer, 0, 1.0f, IT_CHECKPOINT_INTERVAL, NULL);
		if (l < IT_CHECKPOINT_INTERVAL) {
			_dumb_it_end_sigrenderer(sigrenderer);
			checkpoint->next = NULL;
			return checkpoint->time + l;
		}

		checkpoint->next = malloc(sizeof(*checkpoint->next));
		if (!checkpoint->next) {
			_dumb_it_end_sigrenderer(sigrenderer);
			return checkpoint->time + IT_CHECKPOINT_INTERVAL;
		}

		checkpoint->next->time = checkpoint->time + IT_CHECKPOINT_INTERVAL;
		checkpoint = checkpoint->next;
		checkpoint->sigrenderer = sigrenderer;

		if (checkpoint->time >= FUCKIT_THRESHOLD) {
			checkpoint->next = NULL;
			return 0;
		}
	}
}